

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
polyscope::render::backend_openGL_mock::GLFrameBuffer::readBuffer
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          GLFrameBuffer *this)

{
  allocator_type local_11;
  
  (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (long)(int)((this->super_FrameBuffer).sizeX * (this->super_FrameBuffer).sizeY * 4),
             &local_11);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> GLFrameBuffer::readBuffer() {
  bind();

  int w = getSizeX();
  int h = getSizeY();

  // Read from openGL
  size_t buffSize = w * h * 4;
  std::vector<unsigned char> buff(buffSize);

  return buff;
}